

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<true,duckdb::interval_t,duckdb::GreaterThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  data_ptr_t pdVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  value_type vVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  long lVar8;
  const_reference pvVar9;
  idx_t iVar10;
  idx_t iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  idx_t iVar17;
  idx_t iVar18;
  long lVar19;
  bool bVar20;
  interval_t *lhs_data;
  uchar **rhs_locations;
  idx_t local_80;
  idx_t local_70;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar2 = (lhs_format->unified).sel;
    pdVar1 = (lhs_format->unified).data;
    pdVar3 = rhs_row_locations->data;
    pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar9;
      local_70 = *no_match_count;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      local_80 = 0;
      iVar18 = 0;
      do {
        iVar17 = iVar18;
        if (psVar5 != (sel_t *)0x0) {
          iVar17 = (idx_t)psVar5[iVar18];
        }
        iVar10 = iVar17;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar17];
        }
        lVar8 = *(long *)(pdVar3 + iVar17 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar8 + (col_idx >> 3))) == 0) {
LAB_00adeb18:
          *no_match_count = local_70 + 1;
          no_match_sel->sel_vector[local_70] = (sel_t)iVar17;
          local_70 = local_70 + 1;
        }
        else {
          lVar13 = *(long *)(lVar8 + vVar4);
          lVar19 = iVar10 * 0x10;
          lVar8 = *(long *)(lVar8 + 8 + vVar4);
          lVar15 = (long)*(int *)(pdVar1 + lVar19 + 4) +
                   *(long *)(pdVar1 + lVar19 + 8) / 86400000000;
          lVar12 = lVar15 % 0x1e;
          lVar16 = (long)*(int *)(pdVar1 + lVar19) + lVar15 / 0x1e;
          lVar14 = (lVar13 >> 0x20) + lVar8 / 86400000000;
          lVar15 = lVar14 % 0x1e;
          lVar13 = (long)(int)lVar13 + lVar14 / 0x1e;
          if ((lVar16 <= lVar13) &&
             ((lVar16 < lVar13 ||
              ((lVar12 <= lVar15 &&
               ((lVar12 < lVar15 ||
                (*(long *)(pdVar1 + lVar19 + 8) % 86400000000 <= lVar8 % 86400000000))))))))
          goto LAB_00adeb18;
          psVar5[local_80] = (sel_t)iVar17;
          local_80 = local_80 + 1;
        }
        iVar18 = iVar18 + 1;
        if (count == iVar18) {
          return local_80;
        }
      } while( true );
    }
  }
  else {
    pdVar1 = rhs_row_locations->data;
    pSVar2 = (lhs_format->unified).sel;
    pdVar3 = (lhs_format->unified).data;
    pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar9;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      puVar7 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      local_80 = 0;
      iVar17 = 0;
      iVar18 = *no_match_count;
      do {
        iVar10 = iVar17;
        if (psVar5 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar5[iVar17];
        }
        iVar11 = iVar10;
        if (psVar6 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar6[iVar10];
        }
        if (puVar7 == (unsigned_long *)0x0) {
          bVar20 = false;
        }
        else {
          bVar20 = (puVar7[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0;
        }
        if ((bVar20) ||
           (lVar8 = *(long *)(pdVar1 + iVar10 * 8),
           ((uint)*(byte *)(lVar8 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) == 0)) {
LAB_00ade940:
          iVar11 = iVar18 + 1;
          *no_match_count = iVar11;
          no_match_sel->sel_vector[iVar18] = (sel_t)iVar10;
        }
        else {
          lVar13 = *(long *)(lVar8 + vVar4);
          lVar12 = iVar11 * 0x10;
          lVar8 = *(long *)(lVar8 + 8 + vVar4);
          lVar15 = (long)*(int *)(pdVar3 + lVar12 + 4) +
                   *(long *)(pdVar3 + lVar12 + 8) / 86400000000;
          lVar19 = lVar15 % 0x1e;
          lVar16 = (long)*(int *)(pdVar3 + lVar12) + lVar15 / 0x1e;
          lVar14 = (lVar13 >> 0x20) + lVar8 / 86400000000;
          lVar15 = lVar14 % 0x1e;
          lVar13 = (long)(int)lVar13 + lVar14 / 0x1e;
          if ((lVar16 <= lVar13) &&
             ((lVar16 < lVar13 ||
              ((lVar19 <= lVar15 &&
               ((lVar19 < lVar15 ||
                (*(long *)(pdVar3 + lVar12 + 8) % 86400000000 <= lVar8 % 86400000000))))))))
          goto LAB_00ade940;
          psVar5[local_80] = (sel_t)iVar10;
          local_80 = local_80 + 1;
          iVar11 = iVar18;
        }
        iVar17 = iVar17 + 1;
        iVar18 = iVar11;
        if (count == iVar17) {
          return local_80;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}